

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterReader.cpp
# Opt level: O2

long __thiscall ParameterReader::_find(ParameterReader *this,string *name)

{
  pointer pbVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  string local_90;
  string local_70;
  string local_50;
  
  uVar3 = 0;
  do {
    uVar4 = (ulong)uVar3;
    pbVar1 = (this->names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->names).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar4) {
      return 0xffffffffffffffff;
    }
    std::__cxx11::string::string((string *)&local_90,(string *)name);
    AfterburnerUtil::trim(&local_70,&local_90);
    AfterburnerUtil::toLower(&local_50,&local_70);
    iVar2 = std::__cxx11::string::compare((string *)(pbVar1 + uVar4));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    uVar3 = uVar3 + 1;
  } while (iVar2 != 0);
  return uVar4;
}

Assistant:

long ParameterReader::_find(string name) const {
    /*
      Check if the parameter with "name" already exists in the internal
      "names" list. If yes, it returns its
    */
    for (unsigned int ii = 0; ii < names.size(); ii++) {
        if (names[ii].compare(toLower(trim(name))) == 0) {
            return ii;
        }
    }
    return -1;
}